

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

var __thiscall cs::function::call_rl(function *this,function *_this,vector *args)

{
  element_type *peVar1;
  stack_pointer psVar2;
  undefined *puVar3;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  pointer paVar6;
  ulong uVar7;
  stack_type<cs::domain_type,_std::allocator> *this_01;
  long lVar8;
  long lVar9;
  scope_guard scope;
  fcall_guard fcall;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [3];
  string local_50;
  
  puVar3 = current_process;
  if ((*current_process & 1) != 0) {
    LOCK();
    *current_process = 0;
    UNLOCK();
    event_type::touch((event_type *)(puVar3 + 0xf8),(void *)0x0);
  }
  if ((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    peVar1 = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    psVar2 = *(peVar1->super_runtime_type).storage.fiber_stack;
    this_01 = (stack_type<cs::domain_type,_std::allocator> *)
              ((long)&(peVar1->super_runtime_type).storage + 0x30);
    if (psVar2 != (stack_pointer)0x0) {
      this_01 = psVar2;
    }
    local_f0._M_dataplus._M_p = (pointer)_this;
    stack_type<cs::domain_type,_std::allocator>::push<>(this_01);
    stack_type<cs_impl::any,std::allocator>::push<cs::pointer_const&>
              ((stack_type<cs_impl::any,std::allocator> *)(current_process + 0x80),
               (pointer *)&null_pointer);
    stack_type<std::__cxx11::string,std::allocator>::push<std::__cxx11::string_const&>
              ((stack_type<std::__cxx11::string,std::allocator> *)(current_process + 0xa8),
               &_this->mDecl);
    if (_this->mMatch == true) {
      cs_debugger_func_callback(&_this->mDecl,_this->mStmt);
    }
    paVar6 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar6) {
      lVar8 = 0;
      lVar9 = 0;
      uVar7 = 0;
      do {
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(((((_this->mContext).
                        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_runtime_type).storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((_this->mArgs).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9),
                   (var *)((long)&paVar6->mDat + lVar8));
        uVar7 = uVar7 + 1;
        paVar6 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0x20;
        lVar8 = lVar8 + 8;
      } while (uVar7 < (ulong)((long)(args->
                                     super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3
                              ));
    }
    local_130[0]._M_dataplus._M_p =
         (pointer)(*(_this->mBody).
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur)[1]._vptr_statement_base;
    runtime_type::parse_expr
              ((runtime_type *)this,
               (iterator *)
               (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,SUB81(local_130,0));
    fcall_guard::~fcall_guard((fcall_guard *)local_b0);
    scope_guard::~scope_guard((scope_guard *)&local_f0);
    return (var)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string
            (&local_d0,
             (long)(_this->mArgs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(_this->mArgs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::operator+(local_b0,"Wrong size of arguments. Expected ",&local_d0);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_b0);
  local_130[0]._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_130[0]._M_dataplus._M_p == psVar5) {
    local_130[0].field_2._0_8_ = *psVar5;
    local_130[0].field_2._8_8_ = plVar4[3];
    local_130[0]._M_dataplus._M_p = (pointer)&local_130[0].field_2;
  }
  else {
    local_130[0].field_2._0_8_ = *psVar5;
  }
  local_130[0]._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string
            (&local_50,
             (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_f0,local_130,&local_50);
  runtime_error::runtime_error(this_00,&local_f0);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var function::call_rl(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (args.size() != _this->mArgs.size())
			throw runtime_error(
			    "Wrong size of arguments. Expected " + std::to_string(_this->mArgs.size()) + ", provided " +
			    std::to_string(args.size()));
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#endif
		for (std::size_t i = 0; i < args.size(); ++i)
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs[i], args[i]);
		try {
			return _this->mContext->instance->parse_expr(static_cast<const statement_return *>(_this->mBody.front())->get_tree().root());
		}
		catch (const cs::exception &e) {
			throw e;
		}
		catch (const std::exception &e) {
			const statement_base *ptr = _this->mBody.front();
			throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
		}
	}